

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_stmt *pStmt;
  sqlite3_context *psVar1;
  int iVar2;
  RtreeNode *pNode_00;
  i64 iVar3;
  sqlite3_value *pValue;
  RtreeNode *pNode;
  int rc;
  RtreeCoord c;
  RtreeSearchPoint *p;
  RtreeCursor *pCsr;
  Rtree *pRtree;
  sqlite3_context *psStack_20;
  int i_local;
  sqlite3_context *ctx_local;
  sqlite3_vtab_cursor *cur_local;
  
  pCsr = (RtreeCursor *)cur->pVtab;
  p = (RtreeSearchPoint *)cur;
  pRtree._4_4_ = i;
  psStack_20 = ctx;
  ctx_local = (sqlite3_context *)cur;
  _rc = rtreeSearchPointFirst((RtreeCursor *)cur);
  pNode._0_4_ = 0;
  pNode_00 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)p,(int *)&pNode);
  psVar1 = psStack_20;
  if ((int)pNode == 0) {
    if (_rc == (RtreeSearchPoint *)0x0) {
      cur_local._4_4_ = 0;
    }
    else {
      if (pRtree._4_4_ == 0) {
        iVar3 = nodeGetRowid((Rtree *)pCsr,pNode_00,(uint)_rc->iCell);
        sqlite3_result_int64(psVar1,iVar3);
      }
      else if ((int)(uint)*(byte *)((long)&pCsr->nPoint + 1) < pRtree._4_4_) {
        if (*(char *)((long)&p->id + 2) == '\0') {
          if (p[2].id == 0) {
            iVar2 = sqlite3_prepare_v3((sqlite3 *)pCsr->aConstraint,(char *)pCsr->aNode[0],-1,0,
                                       (sqlite3_stmt **)&p[2].id,(char **)0x0);
            if (iVar2 != 0) {
              return iVar2;
            }
            pNode._0_4_ = 0;
          }
          pStmt = (sqlite3_stmt *)p[2].id;
          iVar3 = nodeGetRowid((Rtree *)pCsr,pNode_00,(uint)_rc->iCell);
          sqlite3_bind_int64(pStmt,1,iVar3);
          pNode._0_4_ = sqlite3_step((sqlite3_stmt *)p[2].id);
          if ((int)pNode != 100) {
            sqlite3_reset((sqlite3_stmt *)p[2].id);
            if ((int)pNode == 0x65) {
              pNode._0_4_ = 0;
            }
            return (int)pNode;
          }
          *(undefined1 *)((long)&p->id + 2) = 1;
          pNode._0_4_ = 100;
        }
        psVar1 = psStack_20;
        pValue = sqlite3_column_value
                           ((sqlite3_stmt *)p[2].id,
                            (pRtree._4_4_ - (uint)*(byte *)((long)&pCsr->nPoint + 1)) + 1);
        sqlite3_result_value(psVar1,pValue);
      }
      else {
        nodeGetCoord((Rtree *)pCsr,pNode_00,(uint)_rc->iCell,pRtree._4_4_ + -1,
                     (RtreeCoord *)((long)&pNode + 4));
        if (*(char *)((long)&pCsr->nPoint + 2) == '\0') {
          sqlite3_result_double(psStack_20,(double)pNode._4_4_);
        }
        else {
          sqlite3_result_int(psStack_20,(int)pNode._4_4_);
        }
      }
      cur_local._4_4_ = 0;
    }
  }
  else {
    cur_local._4_4_ = (int)pNode;
  }
  return cur_local._4_4_;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1, 
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }  
  return SQLITE_OK;
}